

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.cpp
# Opt level: O2

void ast::Sections::load_memory_space(void)

{
  value_type pSVar1;
  reference ppSVar2;
  uint uVar3;
  
  for (uVar3 = 0; (ulong)uVar3 < (ulong)(DAT_0013caa8 - table >> 3); uVar3 = uVar3 + 1) {
    ppSVar2 = std::vector<ast::Section_*,_std::allocator<ast::Section_*>_>::at
                        ((vector<ast::Section_*,_std::allocator<ast::Section_*>_> *)&table,
                         (ulong)uVar3);
    pSVar1 = *ppSVar2;
    if ((pSVar1->flags & 1) != 0) {
      Memory_space::write((Memory_space *)memory,pSVar1->base_address,pSVar1->content,
                          (ulong)pSVar1->content_size);
    }
  }
  return;
}

Assistant:

void Sections::load_memory_space()
{
	for (auto i = 0U; i < Sections::table.size(); ++i) {
		Section *section = Sections::table.at(i);
		if ((section->flags & Section::LOADABLE) == 0)
			continue;
		memory.write(section->base_address, section->content, section->content_size);
	}
}